

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,int prec)

{
  int iVar1;
  long in_RDI;
  double norm;
  int gain;
  int orient;
  int level;
  int resno;
  double stepsize;
  int bandno;
  int numbands;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  int numbps;
  int stepsize_00;
  double local_20;
  int local_14;
  
  iVar1 = *(int *)(in_RDI + 4);
  for (local_14 = 0; local_14 < iVar1 * 3 + -2; local_14 = local_14 + 1) {
    if (local_14 == 0) {
      stepsize_00 = 0;
      numbps = 0;
    }
    else {
      stepsize_00 = (local_14 + -1) / 3 + 1;
      numbps = (local_14 + -1) % 3 + 1;
    }
    if (*(int *)(in_RDI + 0x14) == 0) {
      uVar2 = 0;
    }
    else if (numbps == 0) {
      in_stack_ffffffffffffffb8 = 0;
      uVar2 = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 = 2;
      uVar2 = in_stack_ffffffffffffffb8;
      if (numbps == 1 || numbps == 2) {
        in_stack_ffffffffffffffb8 = 1;
        uVar2 = in_stack_ffffffffffffffb8;
      }
    }
    if (*(int *)(in_RDI + 0x18) == 0) {
      local_20 = 1.0;
    }
    else {
      local_20 = (double)(1 << (sbyte)uVar2) /
                 dwt_norms_real[numbps][(*(int *)(in_RDI + 4) + -1) - stepsize_00];
    }
    floor(local_20 * 8192.0);
    dwt_encode_stepsize(stepsize_00,numbps,
                        (opj_stepsize_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, int prec) {
	int numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		double stepsize;
		int resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			double norm = dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		dwt_encode_stepsize((int) floor(stepsize * 8192.0), prec + gain, &tccp->stepsizes[bandno]);
	}
}